

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

void __thiscall DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(DbCheckPostLower *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *this_00;
  Instr *startingCallInstrSequence;
  Instr *instr_local;
  DbCheckPostLower *this_local;
  
  if ((instr->m_opcode != CALL) || (bVar2 = IR::Instr::HasLazyBailOut(instr), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x156,"(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut())",
                       "instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  startingCallInstrSequence = instr->m_next;
  do {
    bVar2 = IsEndBoundary(this,startingCallInstrSequence);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      EnsureValidEndBoundary(this,startingCallInstrSequence);
      return;
    }
    bVar2 = IR::Instr::IsPragmaInstr(startingCallInstrSequence);
    if (!bVar2) {
      bVar2 = IsAssign(this,startingCallInstrSequence);
      if (bVar2) {
        this_00 = IR::Instr::GetDst(startingCallInstrSequence);
        bVar2 = IR::Opnd::IsRegOpnd(this_00);
        if ((!bVar2) && ((startingCallInstrSequence->m_noLazyHelperAssert & 1U) == 0)) {
          IR::Instr::Dump(startingCallInstrSequence);
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x166,"(false)",
                             "Nested helper call. Non-register operand for destination.");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
      }
      else {
        bVar2 = IsCallToHelper(this,instr,HelperOp_Typeof);
        if (bVar2) {
          bVar2 = IsCallToHelper(this,startingCallInstrSequence,HelperOp_Equal);
          if ((((!bVar2) &&
               (bVar2 = IsCallToHelper(this,startingCallInstrSequence,HelperOp_StrictEqual), !bVar2)
               ) && (bVar2 = IsCallToHelper(this,startingCallInstrSequence,HelperOP_CmEq_A), !bVar2)
              ) && (bVar2 = IsCallToHelper(this,startingCallInstrSequence,HelperOP_CmNeq_A), !bVar2)
             ) {
            IR::Instr::Dump(startingCallInstrSequence);
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x177,"(false)",
                               "Nested helper call. Branch TypeOf/Equal doesn\'t match.");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
        }
        else if (startingCallInstrSequence->m_opcode != LEA) {
          IR::Instr::Dump(startingCallInstrSequence);
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x181,"(false)","Nested helper call. Not assignment after CALL.");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
      }
    }
    startingCallInstrSequence = startingCallInstrSequence->m_next;
  } while( true );
}

Assistant:

void
DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(IR::Instr *instr)
{
    IR::Instr *startingCallInstrSequence = instr;
    Assert(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut());
    instr = instr->m_next;
    while (!this->IsEndBoundary(instr))
    {
        if (!instr->IsPragmaInstr())
        {
            if (this->IsAssign(instr))
            {
                if (!instr->GetDst()->IsRegOpnd())
                {
                    // Instructions such as Op_SetElementI with LazyBailOut are
                    // followed by a MOV to re-enable implicit calls, don't throw
                    // in such cases.
                    if (!instr->m_noLazyHelperAssert)
                    {
                        instr->Dump();
                        AssertMsg(false, "Nested helper call. Non-register operand for destination.");
                    }
                }
            }
            else if (this->IsCallToHelper(startingCallInstrSequence, IR::HelperOp_Typeof))
            {
                if (this->IsCallToHelper(instr, IR::HelperOp_Equal) ||
                    this->IsCallToHelper(instr, IR::HelperOp_StrictEqual) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmEq_A) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmNeq_A)
                    )
                {
                    // Pattern matched
                }
                else
                {
                    instr->Dump();
                    AssertMsg(false, "Nested helper call. Branch TypeOf/Equal doesn't match.");
                }
            }
            else if (instr->m_opcode == Js::OpCode::LEA)
            {
                // Skip, this is probably NewScArray
            }
            else
            {
                instr->Dump();
                AssertMsg(false, "Nested helper call. Not assignment after CALL.");
            }
        }

        instr = instr->m_next;
    }

    this->EnsureValidEndBoundary(instr);
}